

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

void __thiscall
Assimp::STEP::DB::DB(DB *this,shared_ptr<Assimp::StreamReader<false,_false>_> *reader)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  
  (this->header).timestamp._M_dataplus._M_p = (pointer)&(this->header).timestamp.field_2;
  (this->header).timestamp._M_string_length = 0;
  (this->header).timestamp.field_2._M_local_buf[0] = '\0';
  (this->header).app._M_dataplus._M_p = (pointer)&(this->header).app.field_2;
  (this->header).app._M_string_length = 0;
  (this->header).app.field_2._M_local_buf[0] = '\0';
  (this->header).fileSchema._M_dataplus._M_p = (pointer)&(this->header).fileSchema.field_2;
  (this->header).fileSchema._M_string_length = 0;
  (this->header).fileSchema.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->objects_bytype)._M_t._M_impl.super__Rb_tree_header;
  (this->objects_bytype)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->objects_bytype)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->objects_bytype)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->objects_bytype)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->objects_bytype)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->refs)._M_t._M_impl.super__Rb_tree_header;
  (this->refs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->refs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->refs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->refs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->refs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->inv_whitelist)._M_t._M_impl.super__Rb_tree_header;
  (this->inv_whitelist)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->inv_whitelist)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->inv_whitelist)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->inv_whitelist)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->inv_whitelist)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->reader).super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (reader->
           super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var2 = (reader->
           super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->reader).super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  peVar3 = (reader->
           super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  (this->splitter).mIdx = 0;
  (this->splitter).mCur._M_dataplus._M_p = (pointer)&(this->splitter).mCur.field_2;
  (this->splitter).mCur._M_string_length = 0;
  (this->splitter).mCur.field_2._M_local_buf[0] = '\0';
  (this->splitter).mStream = peVar3;
  (this->splitter).mSwallow = false;
  (this->splitter).mSkip_empty_lines = true;
  (this->splitter).mTrim = true;
  std::__cxx11::string::reserve((ulong)&(this->splitter).mCur);
  LineSplitter::operator++(&this->splitter);
  (this->splitter).mIdx = 0;
  this->evaluated_count = 0;
  this->schema = (ConversionSchema *)0x0;
  return;
}

Assistant:

DB(std::shared_ptr<StreamReaderLE> reader)
            : reader(reader)
            , splitter(*reader,true,true)
            , evaluated_count()
            , schema( nullptr )
        {}